

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O2

_Bool ray_intersect_triangles_with_transform
                (vec3 ro,vec3 rd,vec3 *points,int num_points,mat4 transform,float *t,int *idx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  _Bool _Var6;
  int iVar7;
  long lVar8;
  float *pfVar9;
  float in_XMM0_Dc;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  float in_XMM0_Dd;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  float in_XMM2_Dc;
  float in_XMM2_Dd;
  vec3 vVar10;
  vec3 p;
  vec3 q;
  vec3 a;
  vec3 b;
  float t0;
  float local_b0;
  float local_ac;
  float local_a8;
  float local_a4;
  float local_a0;
  float local_9c;
  undefined8 local_98;
  float local_90;
  float *local_88;
  int *local_80;
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_a8 = ro.z;
  local_78._8_4_ = in_XMM0_Dc;
  local_78._0_8_ = ro._0_8_;
  local_78._12_4_ = in_XMM0_Dd;
  local_68 = rd.x + ro.x;
  fStack_64 = rd.y + ro.y;
  fStack_60 = in_XMM2_Dc + in_XMM0_Dc;
  fStack_5c = in_XMM2_Dd + in_XMM0_Dd;
  local_a4 = rd.z + local_a8;
  pfVar9 = &points[2].z;
  local_b0 = 3.4028235e+38;
  iVar7 = 0;
  local_88 = t;
  local_80 = idx;
  for (lVar8 = 0; lVar8 < num_points; lVar8 = lVar8 + 3) {
    vVar10 = vec3_apply_mat4(*(vec3 *)(pfVar9 + -8),1.0,transform);
    local_9c = vVar10.z;
    local_48._8_4_ = extraout_XMM0_Dc;
    local_48._0_8_ = vVar10._0_8_;
    local_48._12_4_ = extraout_XMM0_Dd;
    vVar10 = vec3_apply_mat4(*(vec3 *)(pfVar9 + -5),1.0,transform);
    local_a0 = vVar10.z;
    local_58._8_4_ = extraout_XMM0_Dc_00;
    local_58._0_8_ = vVar10._0_8_;
    local_58._12_4_ = extraout_XMM0_Dd_00;
    uVar1 = ((vec3 *)(pfVar9 + -2))->x;
    uVar2 = ((vec3 *)(pfVar9 + -2))->y;
    vVar10.y = (float)uVar2;
    vVar10.x = (float)uVar1;
    vVar10.z = *pfVar9;
    vVar10 = vec3_apply_mat4(vVar10,1.0,transform);
    auVar5 = local_48;
    auVar4 = local_58;
    auVar3 = local_78;
    local_90 = vVar10.z;
    local_98 = vVar10._0_8_;
    local_ac = 3.4028235e+38;
    q.y = fStack_64;
    q.x = local_68;
    p.z = local_a8;
    p.x = (float)local_78._0_4_;
    p.y = (float)local_78._4_4_;
    q.z = local_a4;
    a.z = local_9c;
    a.x = (float)local_48._0_4_;
    a.y = (float)local_48._4_4_;
    b.z = local_a0;
    b.x = (float)local_58._0_4_;
    b.y = (float)local_58._4_4_;
    local_78 = auVar3;
    local_58 = auVar4;
    local_48 = auVar5;
    _Var6 = intersect_segment_triangle(p,q,a,b,vVar10,&local_ac);
    if ((_Var6) && (local_ac < local_b0)) {
      *local_80 = iVar7;
      local_b0 = local_ac;
    }
    iVar7 = iVar7 + 1;
    pfVar9 = pfVar9 + 9;
  }
  *local_88 = local_b0;
  return local_b0 < 3.4028235e+38;
}

Assistant:

bool ray_intersect_triangles_with_transform(vec3 ro, vec3 rd, vec3 *points, int num_points, mat4 transform, float *t, int *idx) { 
    float min_t = FLT_MAX;  

    for (int i = 0; i < num_points; i += 3) {
        vec3 tp0 = vec3_apply_mat4(points[i + 0], 1, transform);
        vec3 tp1 = vec3_apply_mat4(points[i + 1], 1, transform);
        vec3 tp2 = vec3_apply_mat4(points[i + 2], 1, transform);

        float t0 = FLT_MAX;
        if (intersect_segment_triangle(ro, vec3_add(ro, rd), tp0, tp1, tp2, &t0)) {
            if (t0 < min_t) {
                min_t = t0;
                *idx = (i / 3);
            }
        }
    }

    *t = min_t;
    return min_t < FLT_MAX;
}